

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O2

void google::DumpStackTrace(int skip_count,DebugWriter *writerfn,void *arg)

{
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  undefined4 in_register_0000003c;
  void *stack [32];
  char local_838 [1024];
  char tmp [1024];
  
  uVar3 = GetStackTrace(stack,0x20,2);
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    pvVar1 = stack[uVar5];
    if (fLB::FLAGS_symbolize_stacktrace == '\x01') {
      bVar2 = Symbolize((void *)((long)pvVar1 + -1),tmp,0x400);
      pcVar4 = "(unknown)";
      if (bVar2) {
        pcVar4 = tmp;
      }
      snprintf(local_838,0x400,"%s@ %*p  %s\n","    ",0x12,pvVar1,pcVar4);
      pcVar4 = local_838;
    }
    else {
      snprintf(tmp,100,"%s@ %*p\n","    ",0x12,pvVar1);
      pcVar4 = tmp;
    }
    (*(code *)CONCAT44(in_register_0000003c,skip_count))(pcVar4,writerfn);
  }
  return;
}

Assistant:

static void DumpStackTrace(int skip_count, DebugWriter* writerfn, void* arg) {
  // Print stack trace
  void* stack[32];
  int depth = GetStackTrace(stack, ARRAYSIZE(stack), skip_count + 1);
  for (int i = 0; i < depth; i++) {
#  if defined(HAVE_SYMBOLIZE)
    if (FLAGS_symbolize_stacktrace) {
      DumpPCAndSymbol(writerfn, arg, stack[i], "    ");
    } else {
      DumpPC(writerfn, arg, stack[i], "    ");
    }
#  else
    DumpPC(writerfn, arg, stack[i], "    ");
#  endif
  }
}